

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
* detail::operator|(array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
                    *__return_storage_ptr__,b_str<char32_t> *str,
                   split_helper_subroutine<detail::split_at_first,_char32_t,_char32_t> *info)

{
  size_type __pos;
  size_type __pos_00;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_40;
  
  __pos = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::find
                    (str,info->delim,0);
  if (__pos == 0xffffffffffffffff) {
    std::__cxx11::u32string::u32string(__return_storage_ptr__->_M_elems,str);
    __return_storage_ptr__->_M_elems[1]._M_dataplus._M_p =
         (pointer)&__return_storage_ptr__->_M_elems[1].field_2;
    __return_storage_ptr__->_M_elems[1]._M_string_length = 0;
    __return_storage_ptr__->_M_elems[1].field_2._M_local_buf[0] = L'\0';
  }
  else {
    std::
    array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
    ::array(__return_storage_ptr__);
    __pos_00 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
               find_first_not_of(str,info->delim,__pos);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    substr(&local_40,str,__pos_00,0xffffffffffffffff);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(__return_storage_ptr__->_M_elems + 1,&local_40);
    std::__cxx11::u32string::~u32string((u32string *)&local_40);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    erase(str,__pos,0xffffffffffffffff);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(__return_storage_ptr__->_M_elems,str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { std::move(str),{} } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(str.find_first_not_of(info.delim, pos));
		str.erase(pos);
		re[0] = std::move(str);
		return re;
	}